

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

void __thiscall
ON_Annotation::SetDimExtension(ON_Annotation *this,ON_DimStyle *parent_style,double extension)

{
  bool bCreateIfNull;
  ON_DimStyle *pOVar1;
  double candidate_value;
  ON_DimStyle *override_style;
  bool bCreate;
  double extension_local;
  ON_DimStyle *parent_style_local;
  ON_Annotation *this_local;
  
  pOVar1 = ON_DimStyle::DimStyleOrDefault(parent_style);
  candidate_value = ON_DimStyle::DimExtension(pOVar1);
  bCreateIfNull = Internal_DimStyleDoubleChanged(extension,candidate_value);
  pOVar1 = Internal_GetOverrideStyle(this,bCreateIfNull);
  if (pOVar1 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetDimExtension(pOVar1,extension);
    ON_DimStyle::SetFieldOverride(pOVar1,DimensionLineExtension,bCreateIfNull);
  }
  return;
}

Assistant:

void ON_Annotation::SetDimExtension(const ON_DimStyle* parent_style, double extension)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = Internal_DimStyleDoubleChanged(extension, parent_style->DimExtension());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetDimExtension(extension);
    override_style->SetFieldOverride(ON_DimStyle::field::DimensionLineExtension, bCreate);
  }
}